

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _c,Allocator *_allocator)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t _elemsize;
  int *piVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  Mat tmp;
  Mat local_78;
  
  iVar5 = this->w;
  iVar1 = this->h;
  iVar2 = this->c;
  iVar7 = _h * _w;
  if (iVar1 * iVar5 * iVar2 == iVar7 * _c) {
    iVar3 = this->dims;
    lVar6 = (long)iVar7;
    if (iVar3 < 3) {
      _elemsize = this->elemsize;
      if ((long)_h * (long)_w - (_elemsize * lVar6 + 0xf & 0xfffffffffffffff0) / _elemsize != 0) {
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->cstep = 0;
        create(__return_storage_ptr__,_w,_h,_c,_elemsize,this->elempack,_allocator);
        if (_c < 1) {
          return __return_storage_ptr__;
        }
        iVar5 = 0;
        uVar8 = 0;
        do {
          memcpy((void *)(__return_storage_ptr__->cstep * uVar8 * __return_storage_ptr__->elemsize +
                         (long)__return_storage_ptr__->data),
                 (void *)(this->elemsize * (long)iVar5 + (long)this->data),this->elemsize * lVar6);
          uVar8 = uVar8 + 1;
          iVar5 = iVar5 + iVar7;
        } while ((uint)_c != uVar8);
        return __return_storage_ptr__;
      }
    }
    else if (iVar2 != _c) {
      reshape(&local_78,this,iVar7 * _c,_allocator);
      reshape(__return_storage_ptr__,&local_78,_w,_h,_c,_allocator);
      if (local_78.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_78.allocator != (Allocator *)0x0) {
        (*(local_78.allocator)->_vptr_Allocator[3])();
        return __return_storage_ptr__;
      }
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      free(local_78.data);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->data = this->data;
    piVar4 = this->refcount;
    __return_storage_ptr__->refcount = piVar4;
    __return_storage_ptr__->elemsize = this->elemsize;
    __return_storage_ptr__->elempack = this->elempack;
    __return_storage_ptr__->allocator = this->allocator;
    __return_storage_ptr__->dims = iVar3;
    __return_storage_ptr__->w = iVar5;
    __return_storage_ptr__->h = iVar1;
    __return_storage_ptr__->c = iVar2;
    __return_storage_ptr__->cstep = this->cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    __return_storage_ptr__->dims = 3;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep =
         (lVar6 * this->elemsize + 0xf & 0xfffffffffffffff0) / this->elemsize;
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c, Allocator* _allocator) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, _allocator);
        return tmp.reshape(_w, _h, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}